

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  Solution *this;
  pointer piVar1;
  pointer piVar2;
  pointer piVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  long lVar9;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_06;
  initializer_list<ListNode_*> __l_07;
  initializer_list<int> __l_08;
  allocator_type local_186;
  allocator_type local_185;
  allocator_type local_184;
  allocator_type local_183;
  allocator_type local_182;
  allocator_type local_181;
  pointer local_180;
  string strb;
  vector<ListNode_*,_std::allocator<ListNode_*>_> lists;
  vector<int,_std::allocator<int>_> rotateArray;
  vector<int,_std::allocator<int>_> bb;
  vector<int,_std::allocator<int>_> aa;
  string strc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ss;
  string stra;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  stra._M_dataplus._M_p = (pointer)0x3c0000003c;
  stra._M_string_length._0_4_ = 0x3c;
  __l._M_len = 3;
  __l._M_array = (iterator)&stra;
  std::vector<int,_std::allocator<int>_>::vector(&aa,__l,(allocator_type *)&strb);
  stra._M_dataplus._M_p = (pointer)0x5a0000000a;
  stra._M_string_length._0_4_ = 10;
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)&stra;
  std::vector<int,_std::allocator<int>_>::vector(&bb,__l_00,(allocator_type *)&strb);
  strb._M_dataplus._M_p = (pointer)0x200000000;
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)&strb;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&stra,__l_01,&local_186);
  strc._M_dataplus._M_p = (pointer)0x500000000;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&strc;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)((long)&stra.field_2 + 8),__l_02,&local_181);
  lists.super__Vector_base<ListNode_*,_std::allocator<ListNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x400000002;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&lists;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l_03,&local_182);
  rotateArray.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x600000001;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&rotateArray;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l_04,&local_183);
  local_d8 = 0x400000005;
  __l_05._M_len = 2;
  __l_05._M_array = (iterator)&local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l_05,&local_184);
  __l_06._M_len = 5;
  __l_06._M_array = (iterator)&stra;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&ss,__l_06,&local_185);
  lVar9 = 0x60;
  do {
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)((long)&stra._M_dataplus._M_p + lVar9));
    lVar9 = lVar9 + -0x18;
  } while (lVar9 != -0x18);
  this = (Solution *)operator_new(1);
  std::__cxx11::string::string((string *)&stra,"dbbca",(allocator *)&strb);
  std::__cxx11::string::string((string *)&strb,"aabcc",(allocator *)&strc);
  std::__cxx11::string::string((string *)&strc,"aadbbcbcac",(allocator *)&lists);
  Solution::maximumsSplicedArray(this,&aa,&bb);
  piVar1 = (pointer)operator_new(0x10);
  *piVar1 = 1;
  piVar1[2] = 0;
  piVar1[3] = 0;
  piVar2 = (pointer)operator_new(0x10);
  *piVar2 = 1;
  piVar2[2] = 0;
  piVar2[3] = 0;
  piVar3 = (pointer)operator_new(0x10);
  *piVar3 = 2;
  piVar3[2] = 0;
  piVar3[3] = 0;
  puVar4 = (undefined4 *)operator_new(0x10);
  *puVar4 = 3;
  *(undefined8 *)(puVar4 + 2) = 0;
  puVar5 = (undefined4 *)operator_new(0x10);
  *puVar5 = 4;
  *(undefined8 *)(puVar5 + 2) = 0;
  local_180 = piVar1;
  puVar6 = (undefined4 *)operator_new(0x10);
  *puVar6 = 4;
  *(undefined8 *)(puVar6 + 2) = 0;
  puVar7 = (undefined4 *)operator_new(0x10);
  *puVar7 = 5;
  *(undefined8 *)(puVar7 + 2) = 0;
  puVar8 = (undefined4 *)operator_new(0x10);
  *puVar8 = 6;
  *(undefined8 *)(puVar8 + 2) = 0;
  *(undefined4 **)(local_180 + 2) = puVar5;
  *(undefined4 **)(puVar5 + 2) = puVar7;
  *(undefined4 **)(piVar2 + 2) = puVar4;
  *(undefined4 **)(puVar4 + 2) = puVar6;
  *(undefined4 **)(piVar3 + 2) = puVar8;
  rotateArray.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = local_180;
  __l_07._M_len = 3;
  __l_07._M_array = (iterator)&rotateArray;
  rotateArray.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar2;
  rotateArray.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar3;
  std::vector<ListNode_*,_std::allocator<ListNode_*>_>::vector
            (&lists,__l_07,(allocator_type *)&local_d8);
  local_d8 = 1;
  uStack_d0 = 0x100000001;
  local_c8 = 1;
  __l_08._M_len = 5;
  __l_08._M_array = (iterator)&local_d8;
  std::vector<int,_std::allocator<int>_>::vector(&rotateArray,__l_08,&local_186);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&rotateArray.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<ListNode_*,_std::allocator<ListNode_*>_>::~_Vector_base
            (&lists.super__Vector_base<ListNode_*,_std::allocator<ListNode_*>_>);
  std::__cxx11::string::~string((string *)&strc);
  std::__cxx11::string::~string((string *)&strb);
  std::__cxx11::string::~string((string *)&stra);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&ss);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&bb.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&aa.super__Vector_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main() {
    vector<int> aa = {60,60,60};
    vector<int> bb = {10,90,10};
//    vector<vector<int>> ss = {{0,1}, {0,2}, {1,2}};
    vector<vector<int>> ss = {{0, 2},
                              {0, 5},
                              {2, 4},
                              {1, 6},
                              {5, 4}};
    auto *a = new Solution();
    string stra = "dbbca";
    string strb = "aabcc";
    string strc = "aadbbcbcac";
    a->maximumsSplicedArray(aa, bb);

    ListNode *one = new ListNode(1);
    ListNode *one1 = new ListNode(1);
    ListNode *two = new ListNode(2);
    ListNode *three = new ListNode(3);
    ListNode *four = new ListNode(4);
    ListNode *four1 = new ListNode(4);
    ListNode *five = new ListNode(5);
    ListNode *six = new ListNode(6);
    ListNode *seven = new ListNode(7);

    one->next = four;
    four->next = five;
    one1->next = three;
    three->next = four1;
    two->next = six;
    vector<ListNode *> lists = {one, one1, two};

    vector<int> rotateArray = {1, 0, 1, 1, 1};

}